

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_endpoint.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  exception *e;
  ostringstream oss_9;
  ostringstream oss_8;
  endpoint rep;
  stream_socket s2;
  stream_socket s1;
  acceptor a;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  endpoint ep;
  char *in_stack_ffffffffffffeb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeba0;
  string local_1240 [32];
  ostringstream local_1220 [376];
  string local_10a8 [39];
  undefined1 local_1081;
  string local_1080 [32];
  ostringstream local_1060 [376];
  endpoint local_ee8 [8];
  stream_socket local_ee0 [48];
  stream_socket local_eb0 [48];
  acceptor local_e80 [55];
  allocator local_e49;
  string local_e48 [32];
  endpoint local_e28 [15];
  undefined1 local_e19;
  string local_e18 [32];
  ostringstream local_df8 [383];
  undefined1 local_c79;
  string local_c78 [32];
  ostringstream local_c58 [376];
  string local_ae0 [39];
  allocator local_ab9;
  string local_ab8 [39];
  undefined1 local_a91;
  string local_a90 [32];
  ostringstream local_a70 [383];
  allocator local_8f1;
  string local_8f0 [39];
  undefined1 local_8c9;
  string local_8c8 [32];
  ostringstream local_8a8 [383];
  undefined1 local_729;
  string local_728 [32];
  ostringstream local_708 [383];
  undefined1 local_589;
  string local_588 [32];
  ostringstream local_568 [376];
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [39];
  undefined1 local_3a1;
  string local_3a0 [32];
  ostringstream local_380 [383];
  undefined1 local_201;
  string local_200 [32];
  ostringstream local_1e0 [376];
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  endpoint local_10 [12];
  undefined4 local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"127.0.0.1",&local_31);
  booster::aio::endpoint::endpoint(local_10,local_30,0x1f90);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  booster::aio::endpoint::ip_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  std::__cxx11::string::~string(local_68);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar3 = std::operator<<((ostream *)local_1e0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xe);
    std::operator<<(poVar3," ep.ip()==\"127.0.0.1\"");
    local_201 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_200);
    local_201 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = booster::aio::endpoint::port();
  if (iVar2 != 0x1f90) {
    std::__cxx11::ostringstream::ostringstream(local_380);
    poVar3 = std::operator<<((ostream *)local_380,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf);
    std::operator<<(poVar3," ep.port() == 8080");
    local_3a1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3a0);
    local_3a1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"192.168.2.100",&local_3c9);
  booster::aio::endpoint::ip((string *)local_10);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  booster::aio::endpoint::ip_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  std::__cxx11::string::~string(local_3f0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_568);
    poVar3 = std::operator<<((ostream *)local_568,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x11);
    std::operator<<(poVar3," ep.ip()==\"192.168.2.100\"");
    local_589 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_588);
    local_589 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::aio::endpoint::port((int)local_10);
  iVar2 = booster::aio::endpoint::port();
  if (iVar2 != 10) {
    std::__cxx11::ostringstream::ostringstream(local_708);
    poVar3 = std::operator<<((ostream *)local_708,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x13);
    std::operator<<(poVar3," ep.port()==10");
    local_729 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_728);
    local_729 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = booster::aio::endpoint::family();
  if (iVar2 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_8a8);
    poVar3 = std::operator<<((ostream *)local_8a8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x14);
    std::operator<<(poVar3," ep.family()==io::pf_inet");
    local_8c9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_8c8);
    local_8c9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f0,"::1",&local_8f1);
  booster::aio::endpoint::ip((string *)local_10);
  std::__cxx11::string::~string(local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  iVar2 = booster::aio::endpoint::family();
  if (iVar2 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_a70);
    poVar3 = std::operator<<((ostream *)local_a70,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x17);
    std::operator<<(poVar3," ep.family()==io::pf_inet6");
    local_a91 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_a90);
    local_a91 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ab8,"/tmp/test",&local_ab9);
  booster::aio::endpoint::path((string *)local_10);
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  booster::aio::endpoint::path_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  std::__cxx11::string::~string(local_ae0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_c58);
    poVar3 = std::operator<<((ostream *)local_c58,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b);
    std::operator<<(poVar3," ep.path()==\"/tmp/test\"");
    local_c79 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_c78);
    local_c79 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = booster::aio::endpoint::family();
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e48,"127.0.0.1",&local_e49);
    booster::aio::endpoint::endpoint(local_e28,local_e48,0x1f90);
    booster::aio::endpoint::operator=(local_10,local_e28);
    booster::aio::endpoint::~endpoint(local_e28);
    std::__cxx11::string::~string(local_e48);
    std::allocator<char>::~allocator((allocator<char> *)&local_e49);
    booster::aio::acceptor::acceptor(local_e80);
    booster::aio::acceptor::open(local_e80,1);
    booster::aio::basic_socket::set_option(local_e80,2,1);
    booster::aio::acceptor::bind((endpoint *)local_e80);
    booster::aio::acceptor::listen((int)local_e80);
    booster::aio::stream_socket::stream_socket(local_eb0);
    booster::aio::stream_socket::open(local_eb0,1);
    booster::aio::stream_socket::connect((endpoint *)local_eb0);
    booster::aio::stream_socket::stream_socket(local_ee0);
    booster::aio::acceptor::accept((stream_socket *)local_e80);
    booster::aio::basic_socket::remote_endpoint();
    iVar2 = booster::aio::endpoint::family();
    if (iVar2 != 1) {
      std::__cxx11::ostringstream::ostringstream(local_1060);
      poVar3 = std::operator<<((ostream *)local_1060,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2d);
      std::operator<<(poVar3," rep.family()==io::pf_inet");
      local_1081 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar4,local_1080);
      local_1081 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::aio::endpoint::ip_abi_cxx11_();
    bVar1 = std::operator==(in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
    std::__cxx11::string::~string(local_10a8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1220);
      poVar3 = std::operator<<((ostream *)local_1220,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2e);
      std::operator<<(poVar3," rep.ip()==\"127.0.0.1\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar4,local_1240);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::aio::endpoint::~endpoint(local_ee8);
    booster::aio::stream_socket::~stream_socket(local_ee0);
    booster::aio::stream_socket::~stream_socket(local_eb0);
    booster::aio::acceptor::~acceptor(local_e80);
    booster::aio::endpoint::~endpoint(local_10);
    poVar3 = std::operator<<((ostream *)&std::cout,"Ok");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream(local_df8);
  poVar3 = std::operator<<((ostream *)local_df8,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1c);
  std::operator<<(poVar3," ep.family()==io::pf_unix");
  local_e19 = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar4,local_e18);
  local_e19 = 0;
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		io::endpoint ep("127.0.0.1",8080);
		TEST(ep.ip()=="127.0.0.1");
		TEST(ep.port() == 8080);
		ep.ip("192.168.2.100");
		TEST(ep.ip()=="192.168.2.100");
		ep.port(10);
		TEST(ep.port()==10);
		TEST(ep.family()==io::pf_inet);
		#ifndef BOOSTER_AIO_NO_PF_INET6
		ep.ip("::1");
		TEST(ep.family()==io::pf_inet6);
		#endif
		#ifndef BOOSTER_WIN32
		ep.path("/tmp/test");
		TEST(ep.path()=="/tmp/test");
		TEST(ep.family()==io::pf_unix);
		#endif
		ep=io::endpoint("127.0.0.1",8080);	
		io::acceptor a;
		a.open(io::pf_inet);
        #ifndef BOOSTER_WIN32
		a.set_option(io::basic_socket::reuse_address,true);
        #endif
		a.bind(ep);
		a.listen(1);

		io::stream_socket s1;
		s1.open(io::pf_inet);
		s1.connect(ep);
		io::stream_socket s2;
		a.accept(s2);
		io::endpoint rep = s2.remote_endpoint();
		TEST(rep.family()==io::pf_inet);
		TEST(rep.ip()=="127.0.0.1");

	}
	catch(std::exception const &e)
	{
		std::cerr<<"Failed:"<< e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}